

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TimeDependencies.cpp
# Opt level: O3

DependencyInfo *
helics::getExecEntryMinFederate
          (TimeDependencies *dependencies,GlobalFederateId self,ConnectionType ignoreType,
          GlobalFederateId ignore)

{
  TimeState TVar1;
  int iVar2;
  int iVar3;
  DependencyInfo *pDVar4;
  DependencyInfo *pDVar5;
  DependencyInfo *pDVar6;
  
  if (getExecEntryMinFederate(helics::TimeDependencies_const&,helics::GlobalFederateId,helics::ConnectionType,helics::GlobalFederateId)
      ::maxDep == '\0') {
    getExecEntryMinFederate();
  }
  pDVar6 = (dependencies->dependencies).
           super__Vector_base<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>.
           _M_impl.super__Vector_impl_data._M_start;
  pDVar4 = (dependencies->dependencies).
           super__Vector_base<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  if (pDVar6 == pDVar4) {
    pDVar5 = &getExecEntryMinFederate::maxDep;
  }
  else {
    pDVar5 = &getExecEntryMinFederate::maxDep;
    do {
      if ((((pDVar6->dependency == true) && (iVar2 = (pDVar6->fedID).gid, iVar2 != ignore.gid)) &&
          (pDVar6->connection != ignoreType && pDVar6->connection != SELF)) &&
         ((((self.gid == -2010000000 || (self.gid == -1700000000)) ||
           ((pDVar6->super_TimeData).minFedActual.gid != self.gid)) &&
          (((TVar1 = (pDVar6->super_TimeData).mTimeState, TVar1 < exec_requested &&
            ((pDVar6->super_TimeData).restrictionLevel <= (pDVar5->super_TimeData).restrictionLevel)
            ) && (((iVar3 = (pDVar5->fedID).gid, iVar3 == -2010000000 ||
                   ((iVar3 == -1700000000 || (iVar2 < iVar3)))) &&
                  (pDVar5 = pDVar6, TVar1 == initialized)))))))) {
        return &getExecEntryMinFederate::maxDep;
      }
      pDVar6 = pDVar6 + 1;
    } while (pDVar6 != pDVar4);
  }
  return pDVar5;
}

Assistant:

const DependencyInfo& getExecEntryMinFederate(const TimeDependencies& dependencies,
                                              GlobalFederateId self,
                                              ConnectionType ignoreType,
                                              GlobalFederateId ignore)
{
    static const DependencyInfo maxDep{Time::maxVal(),
                                       TimeState::initialized,
                                       static_cast<std::uint8_t>(50U)};

    const DependencyInfo* minDep = &maxDep;

    for (const auto& dep : dependencies) {
        if (!dep.dependency) {
            continue;
        }
        if (dep.fedID == ignore) {
            continue;
        }
        if (dep.connection == ConnectionType::SELF || dep.connection == ignoreType) {
            continue;
        }
        if (self.isValid() && dep.minFedActual == self) {
            continue;
        }
        if (dep.mTimeState > TimeState::exec_requested_iterative) {
            continue;
        }
        if (dep.restrictionLevel > minDep->restrictionLevel) {
            continue;
        }
        if (!minDep->fedID.isValid() || dep.fedID < minDep->fedID) {
            minDep = &dep;
            if (minDep->mTimeState == TimeState::initialized) {
                minDep = &maxDep;
                break;
            }
        }
    }
    return *minDep;
}